

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdExtmul<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,wabt::interp::Simd<unsigned_int,(unsigned_char)4>,false>
          (Thread *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long alStack_48 [2];
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> rhs;
  
  alStack_48[1] = 0x12cd15;
  rhs.v = (uint  [4])Pop(this);
  alStack_48[1] = 0x12cd27;
  lhs.v = (uint  [4])Pop(this);
  lVar1 = 2;
  lVar2 = 8;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    *(ulong *)((long)alStack_48 + lVar2 * 2) =
         (ulong)*(uint *)((long)rhs.v + lVar2) * (ulong)*(uint *)((long)lhs.v + lVar2);
    lVar2 = lVar2 + 4;
  }
  alStack_48[1] = 0x12cd65;
  Push(this,(Value)result.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdExtmul() {
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  using U = typename S::LaneType;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = (low ? 0 : S::lanes) + i;
    result[i] = U(lhs[laneidx]) * U(rhs[laneidx]);
  }
  Push(result);
  return RunResult::Ok;
}